

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_features.pb.cc
# Opt level: O0

void __thiscall pb::TestFeatures::SharedCtor(TestFeatures *this,Arena *arena)

{
  Arena *arena_local;
  TestFeatures *this_local;
  
  google::protobuf::MessageLite::internal_visibility();
  Impl_::Impl_((Impl_ *)&this->field_0);
  memset((void *)((long)&this->field_0 + 8),0,0x44);
  return;
}

Assistant:

inline void TestFeatures::SharedCtor(::_pb::Arena* PROTOBUF_NULLABLE arena) {
  new (&_impl_) Impl_(internal_visibility(), arena);
  ::memset(reinterpret_cast<char *>(&_impl_) +
               offsetof(Impl_, file_feature_),
           0,
           offsetof(Impl_, value_lifetime_feature_) -
               offsetof(Impl_, file_feature_) +
               sizeof(Impl_::value_lifetime_feature_));
}